

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_parse_tags(REF_DICT ref_dict,char *tags)

{
  int key;
  uint uVar1;
  char *__ptr;
  char *pcVar2;
  undefined8 uVar3;
  
  if (tags == (char *)0x0) {
    pcVar2 = "tags string is NULL";
    uVar3 = 0x1bc;
  }
  else {
    __ptr = strdup(tags);
    pcVar2 = __ptr;
    if (__ptr != (char *)0x0) {
      while( true ) {
        pcVar2 = strtok(pcVar2,",");
        if (pcVar2 == (char *)0x0) {
          free(__ptr);
          return 0;
        }
        key = atoi(pcVar2);
        uVar1 = ref_dict_store(ref_dict,key,4000);
        if (uVar1 != 0) break;
        pcVar2 = (char *)0x0;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x1c3,
             "ref_phys_parse_tags",(ulong)uVar1,"store");
      return uVar1;
    }
    pcVar2 = "tags copy is NULL";
    uVar3 = 0x1be;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar3,
         "ref_phys_parse_tags",pcVar2);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_phys_parse_tags(REF_DICT ref_dict, const char *tags) {
  REF_INT id, type;
  char *token, *copy;
  RNS(tags, "tags string is NULL");
  copy = strdup(tags);
  RNS(copy, "tags copy is NULL");
  type = 4000;
  token = strtok(copy, ",");
  while (token != NULL) {
    id = atoi(token);
    RSS(ref_dict_store(ref_dict, id, type), "store");
    token = strtok(NULL, ",");
  }
  free(copy);

  return REF_SUCCESS;
}